

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::addOffsetGlobal(Replacer *this,Expression *toExpr,Name memory)

{
  bool bVar1;
  BinaryOp op;
  mapped_type *pmVar2;
  GlobalGet *left;
  Binary *local_48;
  Expression *returnExpr;
  Name offsetGlobal;
  mapped_type memoryIdx;
  Expression *toExpr_local;
  Replacer *this_local;
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  this_local = memory.super_IString.str._M_len;
  pmVar2 = std::
           unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
           ::at(&this->parent->memoryIdxMap,(key_type *)&this_local);
  offsetGlobal.super_IString.str._M_str._4_4_ = *pmVar2;
  _returnExpr = (string_view)
                getOffsetGlobal(this->parent,offsetGlobal.super_IString.str._M_str._4_4_);
  bVar1 = IString::operator_cast_to_bool((IString *)&returnExpr);
  local_48 = (Binary *)toExpr;
  if (bVar1) {
    op = Abstract::getBinary((Type)(this->parent->pointerType).id,Add);
    left = Builder::makeGlobalGet
                     (&this->builder,(Name)_returnExpr,(Type)(this->parent->pointerType).id);
    local_48 = Builder::makeBinary(&this->builder,op,(Expression *)left,toExpr);
  }
  return (Expression *)local_48;
}

Assistant:

Expression* addOffsetGlobal(Expression* toExpr, Name memory) {
      auto memoryIdx = parent.memoryIdxMap.at(memory);
      auto offsetGlobal = parent.getOffsetGlobal(memoryIdx);
      Expression* returnExpr;
      if (offsetGlobal) {
        returnExpr = builder.makeBinary(
          Abstract::getBinary(parent.pointerType, Abstract::Add),
          builder.makeGlobalGet(offsetGlobal, parent.pointerType),
          toExpr);
      } else {
        returnExpr = toExpr;
      }
      return returnExpr;
    }